

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsyntaxhighlighter.cpp
# Opt level: O2

void __thiscall
QSyntaxHighlighterPrivate::reformatBlock(QSyntaxHighlighterPrivate *this,QTextBlock *block)

{
  long *plVar1;
  int iVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&this->field_0x8;
  (this->currentBlock).p = block->p;
  (this->currentBlock).n = block->n;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)&QStack_48);
  iVar2 = QTextBlock::length(block);
  QList<QTextCharFormat>::fill(&this->formatChanges,(parameter_type)&QStack_48,(long)(iVar2 + -1));
  QTextFormat::~QTextFormat((QTextFormat *)&QStack_48);
  QTextBlock::text((QString *)&QStack_48,block);
  (**(code **)(*plVar1 + 0x60))(plVar1,&QStack_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  applyFormatChanges(this);
  (this->currentBlock).p = (QTextDocumentPrivate *)0x0;
  (this->currentBlock).n = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSyntaxHighlighterPrivate::reformatBlock(const QTextBlock &block)
{
    Q_Q(QSyntaxHighlighter);

    Q_ASSERT_X(!currentBlock.isValid(), "QSyntaxHighlighter::reformatBlock()", "reFormatBlock() called recursively");

    currentBlock = block;

    formatChanges.fill(QTextCharFormat(), block.length() - 1);
    q->highlightBlock(block.text());
    applyFormatChanges();

    currentBlock = QTextBlock();
}